

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx512::create_pipeline
          (ConvolutionDepthWise_x86_avx512 *this,Option *opt)

{
  uint uVar1;
  uint _h;
  int iVar2;
  int *piVar3;
  Allocator *pAVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  int iVar8;
  Layer *pLVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  ParamDict pd;
  Allocator *local_48;
  
  if ((this->super_ConvolutionDepthWise).dynamic_weight != 0) {
    return 0;
  }
  switch((this->super_ConvolutionDepthWise).activation_type) {
  case 1:
    pLVar9 = create_layer_cpu(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar9->_vptr_Layer[2])(pLVar9,&pd);
    break;
  case 2:
    pLVar9 = create_layer_cpu(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_ConvolutionDepthWise).activation_params.data);
    (*pLVar9->_vptr_Layer[2])(pLVar9,&pd);
    break;
  case 3:
    pLVar9 = create_layer_cpu(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_ConvolutionDepthWise).activation_params.data);
    ParamDict::set(&pd,1,*(float *)((long)(this->super_ConvolutionDepthWise).activation_params.data
                                   + 4));
    (*pLVar9->_vptr_Layer[2])(pLVar9,&pd);
    break;
  case 4:
    pLVar9 = create_layer_cpu(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar9->_vptr_Layer[2])(pLVar9,&pd);
    break;
  case 5:
    pLVar9 = create_layer_cpu(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar9->_vptr_Layer[2])(pLVar9,&pd);
    break;
  case 6:
    pLVar9 = create_layer_cpu(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_ConvolutionDepthWise).activation_params.data);
    ParamDict::set(&pd,1,*(float *)((long)(this->super_ConvolutionDepthWise).activation_params.data
                                   + 4));
    (*pLVar9->_vptr_Layer[2])(pLVar9,&pd);
    break;
  default:
    pLVar9 = (Layer *)0x0;
    goto LAB_0039d006;
  }
  ParamDict::~ParamDict(&pd);
  (*pLVar9->_vptr_Layer[4])(pLVar9,opt);
LAB_0039d006:
  this->activation = pLVar9;
  if ((opt->use_int8_inference == true) &&
     ((this->super_ConvolutionDepthWise).weight_data.elemsize == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  uVar7._0_4_ = (this->super_ConvolutionDepthWise).kernel_w;
  uVar7._4_4_ = (this->super_ConvolutionDepthWise).kernel_h;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar7;
  auVar6 = vpshufd_avx(auVar10,0x55);
  auVar6 = vpmulld_avx(auVar6,auVar10);
  iVar12 = auVar6._0_4_;
  uVar1 = (this->super_ConvolutionDepthWise).num_output;
  _h = (this->super_ConvolutionDepthWise).group;
  uVar5 = (long)(this->super_ConvolutionDepthWise).weight_data_size / (long)(int)_h;
  uVar5 = (long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) / (long)iVar12;
  if ((_h == uVar1) &&
     ((int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) /
           (long)((int)uVar1 / (int)_h)) * _h == _h)) {
    if (opt->use_packing_layout == true) {
      if ((_h & 0xf) == 0) {
        Mat::reshape((Mat *)&pd,&(this->super_ConvolutionDepthWise).weight_data,iVar12,_h,
                     (Allocator *)0x0);
        convert_packing((Mat *)&pd,&this->weight_data_tm,0x10,opt);
        if (pd.d == (ParamDictPrivate *)0x0) goto LAB_0039d2ec;
        LOCK();
        (pd.d)->params[0].type = (pd.d)->params[0].type + -1;
        UNLOCK();
        if ((pd.d)->params[0].type != 0) goto LAB_0039d2ec;
        if (local_48 != (Allocator *)0x0) {
          (*local_48->_vptr_Allocator[3])();
          goto LAB_0039d2ec;
        }
      }
      else if ((_h & 7) == 0) {
        Mat::reshape((Mat *)&pd,&(this->super_ConvolutionDepthWise).weight_data,iVar12,_h,
                     (Allocator *)0x0);
        convert_packing((Mat *)&pd,&this->weight_data_tm,8,opt);
        if (pd.d == (ParamDictPrivate *)0x0) goto LAB_0039d2ec;
        LOCK();
        (pd.d)->params[0].type = (pd.d)->params[0].type + -1;
        UNLOCK();
        if ((pd.d)->params[0].type != 0) goto LAB_0039d2ec;
        if (local_48 != (Allocator *)0x0) {
          (*local_48->_vptr_Allocator[3])();
          goto LAB_0039d2ec;
        }
      }
      else {
        if ((_h & 3) != 0) goto LAB_0039d0a3;
        Mat::reshape((Mat *)&pd,&(this->super_ConvolutionDepthWise).weight_data,iVar12,_h,
                     (Allocator *)0x0);
        convert_packing((Mat *)&pd,&this->weight_data_tm,4,opt);
        if (pd.d == (ParamDictPrivate *)0x0) goto LAB_0039d2ec;
        LOCK();
        (pd.d)->params[0].type = (pd.d)->params[0].type + -1;
        UNLOCK();
        if ((pd.d)->params[0].type != 0) goto LAB_0039d2ec;
        if (local_48 != (Allocator *)0x0) {
          (*local_48->_vptr_Allocator[3])();
          goto LAB_0039d2ec;
        }
      }
      free(pd._vptr_ParamDict);
      goto LAB_0039d2ec;
    }
LAB_0039d0a3:
    auVar6._0_4_ = (this->super_ConvolutionDepthWise).dilation_w;
    auVar6._4_4_ = (this->super_ConvolutionDepthWise).dilation_h;
    auVar6._8_4_ = (this->super_ConvolutionDepthWise).stride_w;
    auVar6._12_4_ = (this->super_ConvolutionDepthWise).stride_h;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar7;
    auVar6 = vpunpcklqdq_avx(auVar11,auVar6);
    uVar7 = vpcmpd_avx512vl(auVar6,_DAT_005391c0,4);
    iVar12 = (this->super_ConvolutionDepthWise).stride_w;
    iVar2 = (this->super_ConvolutionDepthWise).stride_h;
    if (((iVar2 == 1 && iVar12 == 1) && (uVar7 & 0xf) == 0) ||
       ((iVar2 == 2 && iVar12 == 2) && (uVar7 & 0xf) == 0)) {
      piVar3 = (this->super_ConvolutionDepthWise).weight_data.refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = (this->weight_data_tm).refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pAVar4 = (this->weight_data_tm).allocator;
          if (pAVar4 == (Allocator *)0x0) {
            free((this->weight_data_tm).data);
          }
          else {
            (*pAVar4->_vptr_Allocator[3])();
          }
        }
      }
      piVar3 = (this->super_ConvolutionDepthWise).weight_data.refcount;
      (this->weight_data_tm).data = (this->super_ConvolutionDepthWise).weight_data.data;
      (this->weight_data_tm).refcount = piVar3;
      (this->weight_data_tm).elemsize = (this->super_ConvolutionDepthWise).weight_data.elemsize;
      (this->weight_data_tm).elempack = (this->super_ConvolutionDepthWise).weight_data.elempack;
      (this->weight_data_tm).allocator = (this->super_ConvolutionDepthWise).weight_data.allocator;
      iVar12 = (this->super_ConvolutionDepthWise).weight_data.w;
      iVar2 = (this->super_ConvolutionDepthWise).weight_data.h;
      iVar8 = (this->super_ConvolutionDepthWise).weight_data.d;
      (this->weight_data_tm).dims = (this->super_ConvolutionDepthWise).weight_data.dims;
      (this->weight_data_tm).w = iVar12;
      (this->weight_data_tm).h = iVar2;
      (this->weight_data_tm).d = iVar8;
      (this->weight_data_tm).c = (this->super_ConvolutionDepthWise).weight_data.c;
      (this->weight_data_tm).cstep = (this->super_ConvolutionDepthWise).weight_data.cstep;
      goto LAB_0039d2ec;
    }
  }
  create_group_ops(this,opt);
LAB_0039d2ec:
  if (opt->lightmode == true) {
    piVar3 = (this->super_ConvolutionDepthWise).weight_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pAVar4 = (this->super_ConvolutionDepthWise).weight_data.allocator;
        if (pAVar4 == (Allocator *)0x0) {
          free((this->super_ConvolutionDepthWise).weight_data.data);
        }
        else {
          (*pAVar4->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_ConvolutionDepthWise).weight_data.cstep = 0;
    *(undefined1 (*) [16])((long)&(this->super_ConvolutionDepthWise).weight_data.refcount + 4) =
         (undefined1  [16])0x0;
    (this->super_ConvolutionDepthWise).weight_data.data = (void *)0x0;
    (this->super_ConvolutionDepthWise).weight_data.refcount = (int *)0x0;
    (this->super_ConvolutionDepthWise).weight_data.dims = 0;
    (this->super_ConvolutionDepthWise).weight_data.w = 0;
    (this->super_ConvolutionDepthWise).weight_data.h = 0;
    (this->super_ConvolutionDepthWise).weight_data.d = 0;
    (this->super_ConvolutionDepthWise).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_avx512::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            elempack = channels % 16 == 0 ? 16 : channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

#if __SSE2__
#if __AVX__
        // pack16
#if __AVX512F__
        if (elempack == 16)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 16, opt);
        }
#endif // __AVX512F__

        // pack8
        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 4, opt);
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            // depth-wise specific
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                weight_data_tm = weight_data;
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                weight_data_tm = weight_data;
            }
            else
            {
                create_group_ops(opt);
            }
        }

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}